

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::read_array<unsigned_char,4ul>
          (BinTextReader *this,array<unsigned_char,_4UL> *value)

{
  char *pcVar1;
  bool bVar2;
  reference value_00;
  char *start_4;
  char *start_3;
  char *start_2;
  char *start_1;
  char *start;
  bool end;
  array<unsigned_char,_4UL> *paStack_20;
  uint32_t counter;
  array<unsigned_char,_4UL> *value_local;
  BinTextReader *this_local;
  
  start._4_4_ = 0;
  start._3_1_ = 0;
  pcVar1 = (this->reader).cur_;
  paStack_20 = value;
  value_local = (array<unsigned_char,_4UL> *)this;
  bVar2 = TextReader::read_nested_begin(&this->reader,(bool *)((long)&start + 3));
  if (bVar2) {
    while (((start._3_1_ ^ 0xff) & 1) != 0) {
      if (3 < start._4_4_) {
        bVar2 = fail_msg(this,"counter < S",(this->reader).cur_);
        return bVar2;
      }
      pcVar1 = (this->reader).cur_;
      value_00 = std::array<unsigned_char,_4UL>::operator[](paStack_20,(ulong)start._4_4_);
      bVar2 = TextReader::read_number<unsigned_char>(&this->reader,value_00);
      if (!bVar2) {
        bVar2 = fail_msg(this,"reader.read_number(value[counter])",pcVar1);
        return bVar2;
      }
      pcVar1 = (this->reader).cur_;
      bVar2 = TextReader::read_nested_separator_or_end(&this->reader,(bool *)((long)&start + 3));
      if (!bVar2) {
        bVar2 = fail_msg(this,"reader.read_nested_separator_or_end(end)",pcVar1);
        return bVar2;
      }
      start._4_4_ = start._4_4_ + 1;
    }
    if (start._4_4_ == 4) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = fail_msg(this,"counter == static_cast<uint32_t>(S)",(this->reader).cur_);
    }
  }
  else {
    this_local._7_1_ = fail_msg(this,"reader.read_nested_begin(end)",pcVar1);
  }
  return this_local._7_1_;
}

Assistant:

bool read_array(std::array<T, S>& value) noexcept {
            uint32_t counter = 0;
            bool end = false;
            bin_assert(reader.read_nested_begin(end));
            while (!end) {
                bin_assert(counter < S);
                bin_assert(reader.read_number(value[counter]));
                bin_assert(reader.read_nested_separator_or_end(end));
                counter++;
            }
            bin_assert(counter == static_cast<uint32_t>(S));
            return true;
        }